

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O2

int wally_asset_surjectionproof_size(size_t num_inputs,size_t *written)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = 3;
  if (num_inputs < 3) {
    sVar2 = num_inputs;
  }
  iVar1 = -2;
  if ((written != (size_t *)0x0) && (*written = 0, num_inputs != 0)) {
    *written = sVar2 * 0x20 + (num_inputs + 7 >> 3) + 0x22;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int wally_asset_surjectionproof_size(size_t num_inputs, size_t *written)
{
    size_t num_used = num_inputs > 3 ? 3 : num_inputs;
    if (written)
        *written = 0;
    if (!num_inputs || !written)
        return WALLY_EINVAL;
    *written = SECP256K1_SURJECTIONPROOF_SERIALIZATION_BYTES(num_inputs, num_used);
    return WALLY_OK;
}